

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FederateExport.cpp
# Opt level: O1

void helicsFederateInfoSetCoreInitString(HelicsFederateInfo fedInfo,char *coreinit,HelicsError *err)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  size_t sVar2;
  HelicsFederateInfo pvVar3;
  bool bVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  if ((err == (HelicsError *)0x0) || (err->error_code == 0)) {
    if (fedInfo == (HelicsFederateInfo)0x0) {
      if (err == (HelicsError *)0x0) goto LAB_001a05e3;
    }
    else {
      bVar4 = *(int *)((long)fedInfo + 0x48) == 0x6bfbbce1;
      pvVar3 = (HelicsFederateInfo)0x0;
      if (bVar4) {
        pvVar3 = fedInfo;
      }
      if (bVar4 || err == (HelicsError *)0x0) goto LAB_001a05e6;
    }
    err->error_code = -3;
    err->message = "helics Federate info object was not valid";
  }
LAB_001a05e3:
  pvVar3 = (HelicsFederateInfo)0x0;
LAB_001a05e6:
  if (pvVar3 != (HelicsFederateInfo)0x0) {
    paVar1 = &local_40.field_2;
    local_40._M_dataplus._M_p = (pointer)paVar1;
    if (coreinit == (char *)0x0) {
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_40,gHelicsEmptyStr_abi_cxx11_._M_dataplus._M_p,
                 gHelicsEmptyStr_abi_cxx11_._M_dataplus._M_p +
                 gHelicsEmptyStr_abi_cxx11_._M_string_length);
    }
    else {
      sVar2 = strlen(coreinit);
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,coreinit,coreinit + sVar2)
      ;
    }
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_assign
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               ((long)pvVar3 + 0xe0),&local_40);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_40._M_dataplus._M_p != paVar1) {
      operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
    }
  }
  return;
}

Assistant:

void helicsFederateInfoSetCoreInitString(HelicsFederateInfo fedInfo, const char* coreinit, HelicsError* err)
{
    auto* info = getFedInfo(fedInfo, err);
    if (info == nullptr) {
        return;
    }
    try {
        info->coreInitString = AS_STRING(coreinit);
    }
    catch (...) {  // LCOV_EXCL_LINE
        helicsErrorHandler(err);  // LCOV_EXCL_LINE
    }
}